

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Reg2(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  undefined2 local_26;
  ProfileId local_24;
  byte local_22;
  byte local_21;
  bool success;
  OpLayoutType OStack_20;
  ProfileId profileId2;
  ProfileId profileId;
  bool isProfiled2;
  bool isProfiled;
  RegSlot local_18;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  _profileId = R1;
  local_18 = R0;
  R1_local._2_2_ = op;
  _R0_local = this;
  CheckOpen(this);
  op_00 = R1_local._2_2_;
  OpLayoutType::OpLayoutType(&stack0xffffffffffffffe0,Reg2);
  CheckOp(this,op_00,OStack_20);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(R1_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x181,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_18 = ConsumeReg(this,local_18);
  _profileId = ConsumeReg(this,_profileId);
  local_21 = 0;
  local_22 = 0;
  local_24 = 0xffff;
  local_26 = 0xffff;
  if (((R1_local._2_2_ == BeginSwitch) &&
      (bVar2 = DoDynamicProfileOpcode(this,SwitchOptPhase,false), bVar2)) &&
     (bVar2 = FunctionBody::AllocProfiledSwitch(this->m_functionWrite,&local_24), bVar2)) {
    OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&R1_local + 2));
    local_21 = 1;
  }
  bVar2 = DoProfileNewScObjArrayOp(this,R1_local._2_2_);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x192,"(DoProfileNewScObjArrayOp(op) == false)",
                                "DoProfileNewScObjArrayOp(op) == false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = DoProfileNewScObjectOp(this,R1_local._2_2_);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x194,"(DoProfileNewScObjectOp(op) == false)",
                                "DoProfileNewScObjectOp(op) == false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,R1_local._2_2_,local_18,_profileId);
  if (((!bVar2) &&
      (bVar2 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,R1_local._2_2_,local_18,_profileId), !bVar2)) &&
     (bVar2 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,R1_local._2_2_,local_18,_profileId), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x196,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((local_21 & 1) != 0) &&
     (Data::Encode(&this->m_byteCodeData,&local_24,2), (local_22 & 1) != 0)) {
    Data::Encode(&this->m_byteCodeData,&local_26,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg2(OpCode op, RegSlot R0, RegSlot R1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        bool isProfiled = false;
        bool isProfiled2 = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;
        Js::ProfileId profileId2 = Js::Constants::NoProfileId;

        if (op == Js::OpCode::BeginSwitch && DoDynamicProfileOpcode(SwitchOptPhase) &&
            this->m_functionWrite->AllocProfiledSwitch(&profileId))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
        }

        Assert(DoProfileNewScObjArrayOp(op) == false);

        Assert(DoProfileNewScObjectOp(op) == false);

        MULTISIZE_LAYOUT_WRITE(Reg2, op, R0, R1);

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }